

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl_Menu_add.cxx
# Opt level: O2

int compare(char *a,char *b)

{
  char cVar1;
  char cVar2;
  
  do {
    cVar1 = *a;
    for (; cVar2 = *b, cVar1 != cVar2; b = b + 1) {
      if (cVar1 == '&') goto LAB_0018830e;
      if (cVar2 != '&') goto LAB_00188315;
    }
    if (cVar1 == '\0') {
      cVar2 = '\0';
LAB_00188315:
      return (int)cVar1 - (int)cVar2;
    }
    b = b + 1;
LAB_0018830e:
    a = a + 1;
  } while( true );
}

Assistant:

static int compare(const char* a, const char* b) {
  for (;;) {
    int n = *a-*b;
    if (n) {
      if (*a == '&') a++;
      else if (*b == '&') b++;
      else return n;
    } else if (*a) {
      a++; b++;
    } else {
      return 0;
    }
  }
}